

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O2

JsErrorCode JsDiagGetObjectFromHandle(uint objectHandle,JsValueRef *handleObject)

{
  ScriptContext *scriptContext;
  JsrtRuntime *this;
  DebugManager *pDVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode JVar4;
  int iVar5;
  JsrtContext *pJVar6;
  JsrtDebugManager *this_00;
  JsrtDebuggerObjectsManager *this_01;
  undefined4 extraout_var;
  undefined4 *puVar7;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  TTDebuggerAbortException anon_var_0;
  undefined1 local_68 [8];
  EnterScriptObject __enterScriptObject;
  AutoNestedHandledExceptionType local_34 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  pJVar6 = JsrtContext::GetCurrent();
  JVar4 = CheckContext(pJVar6,false,false);
  if (JVar4 == JsNoError) {
    scriptContext =
         (((pJVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
    AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
              (local_34,ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
    anon_var_0.m_staticAbortMessage = (char16 *)0x0;
    anon_var_0.m_optEventTime = 0;
    anon_var_0.m_optMoveMode = 0;
    auStack_a8 = (undefined1  [8])0x0;
    anon_var_0.m_abortCode = 0;
    anon_var_0._4_4_ = 0;
    Js::EnterScriptObject::EnterScriptObject
              ((EnterScriptObject *)local_68,scriptContext,(ScriptEntryExitRecord *)auStack_a8,
               unaff_retaddr,&stack0x00000000,true,true,true);
    Js::ScriptContext::OnScriptStart(scriptContext,true,true);
    Js::EnterScriptObject::VerifyEnterScript((EnterScriptObject *)local_68);
    if (handleObject == (JsValueRef *)0x0) {
      JVar4 = JsErrorNullArgument;
    }
    else {
      *handleObject = (JsValueRef)0x0;
      pJVar6 = JsrtContext::GetCurrent();
      this = (pJVar6->runtime).ptr;
      pDVar1 = this->threadContext->debugManager;
      JVar4 = JsErrorDiagNotAtBreak;
      if ((pDVar1 != (DebugManager *)0x0) && (pDVar1->isAtDispatchHalt == true)) {
        this_00 = JsrtRuntime::GetJsrtDebugManager(this);
        JVar4 = JsErrorDiagNotInDebugMode;
        if (this_00 != (JsrtDebugManager *)0x0) {
          bVar3 = JsrtDebugManager::IsDebugEventCallbackSet(this_00);
          if (bVar3) {
            __enterScriptObject.library = (JavascriptLibrary *)0x0;
            this_01 = JsrtDebugManager::GetDebuggerObjectsManager(this_00);
            bVar3 = JsrtDebuggerObjectsManager::TryGetDebuggerObjectFromHandle
                              (this_01,objectHandle,
                               (JsrtDebuggerObjectBase **)&__enterScriptObject.library);
            JVar4 = JsErrorDiagInvalidHandle;
            if (bVar3 && __enterScriptObject.library != (JavascriptLibrary *)0x0) {
              iVar5 = (*((__enterScriptObject.library)->super_JavascriptLibraryBase).
                        super_FinalizableObject.super_IRecyclerVisitedObject.
                        _vptr_IRecyclerVisitedObject[2])
                                (__enterScriptObject.library,scriptContext,0);
              if ((JsValueRef)CONCAT44(extraout_var,iVar5) == (JsValueRef)0x0) {
                JVar4 = JsErrorDiagUnableToPerformAction;
              }
              else {
                *handleObject = (JsValueRef)CONCAT44(extraout_var,iVar5);
                JVar4 = JsNoError;
              }
            }
          }
        }
      }
    }
    Js::EnterScriptObject::~EnterScriptObject((EnterScriptObject *)local_68);
    if ((((JVar4 & 0x6ffff) == JsErrorOutOfMemory) ||
        (((JVar4 - JsErrorNoCurrentContext < 7 &&
          ((0x43U >> (JVar4 - JsErrorNoCurrentContext & 0x1f) & 1) != 0)) || (JVar4 == JsErrorFatal)
         ))) || (JVar4 == JsErrorScriptTerminated)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                         ,0xcc,
                         "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                         ,
                         "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar7 = 0;
    }
    AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_34);
  }
  return JVar4;
}

Assistant:

CHAKRA_API JsDiagGetObjectFromHandle(
    _In_ unsigned int objectHandle,
    _Out_ JsValueRef *handleObject)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<false>([&](Js::ScriptContext *scriptContext) -> JsErrorCode {

        PARAM_NOT_NULL(handleObject);

        *handleObject = JS_INVALID_REFERENCE;

        JsrtContext* context = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = context->GetRuntime();

        VALIDATE_RUNTIME_IS_AT_BREAK(runtime);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        VALIDATE_IS_DEBUGGING(jsrtDebugManager);

        JsrtDebuggerObjectBase* debuggerObject = nullptr;
        if (!jsrtDebugManager->GetDebuggerObjectsManager()->TryGetDebuggerObjectFromHandle(objectHandle, &debuggerObject) || debuggerObject == nullptr)
        {
            return JsErrorDiagInvalidHandle;
        }

        Js::DynamicObject* object = debuggerObject->GetJSONObject(scriptContext, /* forceSetValueProp */ false);

        if (object != nullptr)
        {
            *handleObject = object;
            return JsNoError;
        }

        return JsErrorDiagUnableToPerformAction;
    });
#endif
}